

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityHBMatrix.cpp
# Opt level: O1

void __thiscall OpenMD::TetrahedralityHBMatrix::initializeHistogram(TetrahedralityHBMatrix *this)

{
  pointer __s;
  pointer *ppuVar1;
  ulong uVar2;
  
  if ((this->super_StaticAnalyser).nBins_ != 0) {
    ppuVar1 = (pointer *)
              ((long)&(((this->Q_histogram_).
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data + 8);
    uVar2 = 0;
    do {
      __s = ((_Vector_impl_data *)(ppuVar1 + -1))->_M_start;
      if (__s != *ppuVar1) {
        memset(__s,0,((long)*ppuVar1 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
      }
      uVar2 = uVar2 + 1;
      ppuVar1 = ppuVar1 + 3;
    } while (uVar2 < (this->super_StaticAnalyser).nBins_);
  }
  return;
}

Assistant:

void TetrahedralityHBMatrix::initializeHistogram() {
    for (unsigned int i = 0; i < nBins_; i++) {
      std::fill(Q_histogram_[i].begin(), Q_histogram_[i].end(), 0);
    }
  }